

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O3

void tokdefine(tokcxdef *ctx,char *p,int len)

{
  char cVar1;
  int len_00;
  tokdfdef *ptVar2;
  ushort **ppuVar3;
  char *sym;
  int iVar4;
  int explen;
  char *expan;
  char mysym [39];
  char acStack_58 [40];
  
  len_00 = tok_scan_defsym(ctx,p,len);
  if (len_00 != 0) {
    ptVar2 = tok_find_define(ctx,p,len_00);
    if (ptVar2 != (tokdfdef *)0x0) {
      errlogf(ctx->tokcxerr,"TADS",0x75);
      return;
    }
    expan = p + len_00;
    iVar4 = len - len_00;
    explen = 0;
    if (iVar4 != 0) {
      do {
        cVar1 = *expan;
        explen = iVar4;
        if (((long)cVar1 < 0) ||
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) == 0
           )) goto LAB_00117740;
        expan = expan + 1;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      explen = 0;
    }
LAB_00117740:
    sym = tok_casefold_defsym((tokcxdef *)(ulong)(uint)ctx->tokcxflg,acStack_58,p,len_00);
    tok_add_define(ctx,sym,len_00,expan,explen);
  }
  return;
}

Assistant:

static void tokdefine(tokcxdef *ctx, char *p, int len)
{
    char *sym;
    int   symlen;
    char *expan;
    char  mysym[TOKNAMMAX];
    
    /* get the symbol */
    sym = p;
    if (!(symlen = tok_scan_defsym(ctx, p, len)))
        return;

    /* if it's already in the table, log an error */
    if (tok_find_define(ctx, sym, symlen))
    {
        errlog(ctx->tokcxerr, ERR_DEFREDEF);
        return;
    }

    /* skip whitespace following the symbol */
    expan = sym + symlen;
    len -= symlen;
    while (len && t_isspace(*expan)) --len, ++expan;

    /* if we're folding case, convert the symbol to lower case */
    sym = tok_casefold_defsym(ctx, mysym, sym, symlen);

    /* define the symbol */
    tok_add_define(ctx, sym, symlen, expan, len);
}